

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O2

string_t * __thiscall DL::DataLisp::dump_abi_cxx11_(string_t *__return_storage_ptr__,DataLisp *this)

{
  SyntaxTree *pSVar1;
  pointer ppSVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer ppSVar4;
  string_t sStack_48;
  
  pSVar1 = this->mInternal->mTree;
  if (pSVar1 == (SyntaxTree *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_48);
  }
  else {
    paVar3 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ppSVar2 = (pSVar1->Nodes).
              super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppSVar4 = (pSVar1->Nodes).
                   super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar2;
        ppSVar4 = ppSVar4 + 1) {
      DataLisp_Internal::dumpNode_abi_cxx11_
                (&sStack_48,(DataLisp_Internal *)*ppSVar4,(StatementNode *)0x1,(int)paVar3);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string_t DataLisp::dump()
{
	if (!mInternal->mTree) {
		return "";
	} else {
		string_t str;
		for (StatementNode* ptr : mInternal->mTree->Nodes)
			str += DataLisp_Internal::dumpNode(ptr, 1);

		return str;
	}
}